

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall
Buffer_copyout_range_all_but_first_and_last_char_Test::TestBody
          (Buffer_copyout_range_all_but_first_and_last_char_Test *this)

{
  char *pcVar1;
  AssertHelper local_178;
  Message local_170;
  AssertionResult gtest_ar;
  size_t len;
  size_type n_wanted;
  BufferWithReadonlyStrings local;
  array<char,_128UL> array;
  
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local);
  array._M_elems[0x70] = '\0';
  array._M_elems[0x71] = '\0';
  array._M_elems[0x72] = '\0';
  array._M_elems[0x73] = '\0';
  array._M_elems[0x74] = '\0';
  array._M_elems[0x75] = '\0';
  array._M_elems[0x76] = '\0';
  array._M_elems[0x77] = '\0';
  array._M_elems[0x78] = '\0';
  array._M_elems[0x79] = '\0';
  array._M_elems[0x7a] = '\0';
  array._M_elems[0x7b] = '\0';
  array._M_elems[0x7c] = '\0';
  array._M_elems[0x7d] = '\0';
  array._M_elems[0x7e] = '\0';
  array._M_elems[0x7f] = '\0';
  array._M_elems[0x60] = '\0';
  array._M_elems[0x61] = '\0';
  array._M_elems[0x62] = '\0';
  array._M_elems[99] = '\0';
  array._M_elems[100] = '\0';
  array._M_elems[0x65] = '\0';
  array._M_elems[0x66] = '\0';
  array._M_elems[0x67] = '\0';
  array._M_elems[0x68] = '\0';
  array._M_elems[0x69] = '\0';
  array._M_elems[0x6a] = '\0';
  array._M_elems[0x6b] = '\0';
  array._M_elems[0x6c] = '\0';
  array._M_elems[0x6d] = '\0';
  array._M_elems[0x6e] = '\0';
  array._M_elems[0x6f] = '\0';
  array._M_elems[0x50] = '\0';
  array._M_elems[0x51] = '\0';
  array._M_elems[0x52] = '\0';
  array._M_elems[0x53] = '\0';
  array._M_elems[0x54] = '\0';
  array._M_elems[0x55] = '\0';
  array._M_elems[0x56] = '\0';
  array._M_elems[0x57] = '\0';
  array._M_elems[0x58] = '\0';
  array._M_elems[0x59] = '\0';
  array._M_elems[0x5a] = '\0';
  array._M_elems[0x5b] = '\0';
  array._M_elems[0x5c] = '\0';
  array._M_elems[0x5d] = '\0';
  array._M_elems[0x5e] = '\0';
  array._M_elems[0x5f] = '\0';
  array._M_elems[0x40] = '\0';
  array._M_elems[0x41] = '\0';
  array._M_elems[0x42] = '\0';
  array._M_elems[0x43] = '\0';
  array._M_elems[0x44] = '\0';
  array._M_elems[0x45] = '\0';
  array._M_elems[0x46] = '\0';
  array._M_elems[0x47] = '\0';
  array._M_elems[0x48] = '\0';
  array._M_elems[0x49] = '\0';
  array._M_elems[0x4a] = '\0';
  array._M_elems[0x4b] = '\0';
  array._M_elems[0x4c] = '\0';
  array._M_elems[0x4d] = '\0';
  array._M_elems[0x4e] = '\0';
  array._M_elems[0x4f] = '\0';
  array._M_elems[0x30] = '\0';
  array._M_elems[0x31] = '\0';
  array._M_elems[0x32] = '\0';
  array._M_elems[0x33] = '\0';
  array._M_elems[0x34] = '\0';
  array._M_elems[0x35] = '\0';
  array._M_elems[0x36] = '\0';
  array._M_elems[0x37] = '\0';
  array._M_elems[0x38] = '\0';
  array._M_elems[0x39] = '\0';
  array._M_elems[0x3a] = '\0';
  array._M_elems[0x3b] = '\0';
  array._M_elems[0x3c] = '\0';
  array._M_elems[0x3d] = '\0';
  array._M_elems[0x3e] = '\0';
  array._M_elems[0x3f] = '\0';
  array._M_elems[0x20] = '\0';
  array._M_elems[0x21] = '\0';
  array._M_elems[0x22] = '\0';
  array._M_elems[0x23] = '\0';
  array._M_elems[0x24] = '\0';
  array._M_elems[0x25] = '\0';
  array._M_elems[0x26] = '\0';
  array._M_elems[0x27] = '\0';
  array._M_elems[0x28] = '\0';
  array._M_elems[0x29] = '\0';
  array._M_elems[0x2a] = '\0';
  array._M_elems[0x2b] = '\0';
  array._M_elems[0x2c] = '\0';
  array._M_elems[0x2d] = '\0';
  array._M_elems[0x2e] = '\0';
  array._M_elems[0x2f] = '\0';
  array._M_elems[0x10] = '\0';
  array._M_elems[0x11] = '\0';
  array._M_elems[0x12] = '\0';
  array._M_elems[0x13] = '\0';
  array._M_elems[0x14] = '\0';
  array._M_elems[0x15] = '\0';
  array._M_elems[0x16] = '\0';
  array._M_elems[0x17] = '\0';
  array._M_elems[0x18] = '\0';
  array._M_elems[0x19] = '\0';
  array._M_elems[0x1a] = '\0';
  array._M_elems[0x1b] = '\0';
  array._M_elems[0x1c] = '\0';
  array._M_elems[0x1d] = '\0';
  array._M_elems[0x1e] = '\0';
  array._M_elems[0x1f] = '\0';
  array._M_elems[0] = '\0';
  array._M_elems[1] = '\0';
  array._M_elems[2] = '\0';
  array._M_elems[3] = '\0';
  array._M_elems[4] = '\0';
  array._M_elems[5] = '\0';
  array._M_elems[6] = '\0';
  array._M_elems[7] = '\0';
  array._M_elems[8] = '\0';
  array._M_elems[9] = '\0';
  array._M_elems[10] = '\0';
  array._M_elems[0xb] = '\0';
  array._M_elems[0xc] = '\0';
  array._M_elems[0xd] = '\0';
  array._M_elems[0xe] = '\0';
  array._M_elems[0xf] = '\0';
  n_wanted = local.allstrs._M_string_length - 2;
  len = bfy_buffer_copyout_range(&local.buf,1,local.allstrs._M_string_length - 1,&array);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"len","n_wanted",&len,&n_wanted);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_170);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x35e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((long *)CONCAT44(local_170.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_170.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_170.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_170.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_170.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_178.data_._0_4_ = memcmp(local.allstrs._M_dataplus._M_p + 1,&array,len);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","memcmp(std::data(local.allstrs)+1, std::data(array), len)",
             (int *)&local_170,(int *)&local_178);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_170);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x35f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((long *)CONCAT44(local_170.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_170.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_170.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_170.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local);
  return;
}

Assistant:

TEST(Buffer, copyout_range_all_but_first_and_last_char) {
    auto local = BufferWithReadonlyStrings {};
    auto array = std::array<char, 128>{};
    auto const n_wanted = std::size(local.allstrs) - 2;
    auto const begin = 1;
    auto const end = begin + n_wanted;
    auto const len = bfy_buffer_copyout_range(&local.buf, begin, end, std::data(array));
    EXPECT_EQ(len, n_wanted);
    EXPECT_EQ(0, memcmp(std::data(local.allstrs)+1, std::data(array), len));
}